

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_receive_pdu(rtr_socket *rtr_socket,void *pdu,size_t pdu_len,time_t timeout)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  pdu_error_type pVar5;
  int iVar6;
  uint uVar7;
  rtr_socket_state new_state;
  char *pcVar8;
  uint32_t err_text_len;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  pdu_header header;
  char txt [43];
  undefined8 local_70;
  char local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = -1;
  if (rtr_socket->state == RTR_SHUTDOWN) goto LAB_0010a37f;
  iVar4 = tr_recv_all(rtr_socket->tr_socket,pdu,8,pdu_len);
  if (iVar4 < 0) goto LAB_0010a20d;
  local_70 = *pdu;
  rtr_pdu_convert_header_byte_order(&local_70,TO_HOST_HOST_BYTE_ORDER);
  uVar2 = local_70._4_4_;
  iVar4 = 0;
  if ((local_70._4_4_ < 8) || (iVar4 = 0x20, 0xffff < local_70._4_4_)) goto LAB_0010a20d;
  if (rtr_socket->has_received_pdus == false) {
    if (local_70._1_1_ != '\n') {
      uVar1 = rtr_socket->version;
      uVar7 = (uint)(byte)local_70;
      if (((byte)local_70 <= uVar1 && uVar1 != uVar7) && (byte)local_70 < 3) {
        lrtr_dbg("RTR Socket: First received PDU is a version %u PDU, downgrading from version %u to %u"
                 ,(ulong)uVar7,(ulong)uVar1,(ulong)uVar7);
        rtr_socket->version = uVar7;
      }
    }
    rtr_socket->has_received_pdus = true;
  }
  bVar3 = local_70._1_1_;
  iVar4 = 8;
  if (rtr_socket->version != (uint)(byte)local_70 && local_70._1_1_ != 10) goto LAB_0010a20d;
  if (uVar2 - 8 != 0) {
    if (rtr_socket->state == RTR_SHUTDOWN) goto LAB_0010a37f;
    iVar4 = tr_recv_all(rtr_socket->tr_socket,(void *)((long)pdu + 8),(ulong)(uVar2 - 8),0x3c);
    if (iVar4 < 0) goto LAB_0010a20d;
  }
  *(ulong *)pdu = local_70;
  pcVar8 = "RTR Socket: PDU type is unknown or reserved!";
  switch(*(undefined1 *)((long)pdu + 1)) {
  case 0:
  case 1:
    iVar4 = 0xc;
    break;
  case 2:
  case 3:
  case 8:
    iVar4 = 8;
    break;
  case 4:
    iVar4 = 0x14;
    break;
  default:
    goto switchD_0010a1fe_caseD_5;
  case 6:
    iVar4 = 0x20;
    break;
  case 7:
    if (((*pdu == '\0') && (*(int *)((long)pdu + 4) == 0xc)) ||
       (((byte)(*pdu - 1U) < 2 && (*(int *)((long)pdu + 4) == 0x18)))) goto LAB_0010a3e2;
    goto LAB_0010a554;
  case 9:
    iVar4 = 0x7b;
    break;
  case 10:
    if (*(uint *)((long)pdu + 4) < 0x10) {
      pcVar8 = "RTR Socket: PDU is too small to contain \"Length of Error Text\" field!";
    }
    else {
      uVar2 = *(uint *)((long)pdu + 8);
      uVar9 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     uVar2 << 0x18);
      lrtr_dbg("RTR Socket: enc_pdu_len: %u",uVar9);
      if ((ulong)*(uint *)((long)pdu + 4) < uVar9 + 0x10) {
        pcVar8 = "RTR Socket: PDU is too small to contain erroneous PDU!";
      }
      else {
        uVar2 = *(uint *)((long)pdu + uVar9 + 0xc);
        uVar10 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18);
        lrtr_dbg("RTR Socket: err_msg_len: %u",uVar10);
        if (uVar9 + 0x10 + uVar10 == (ulong)*(uint *)((long)pdu + 4)) goto LAB_0010a3e2;
        pcVar8 = "RTR Socket: PDU is too small to contain error_msg!";
      }
    }
    goto switchD_0010a1fe_caseD_5;
  case 0xb:
    if (*(uint *)((long)pdu + 4) < 0x10) {
      pcVar8 = "RTR Socket: PDU is too small to contain ASPA PDU!";
    }
    else {
      if ((uint)(ushort)(*(ushort *)((long)pdu + 10) << 8 | *(ushort *)((long)pdu + 10) >> 8) * 4 +
          0x10 == *(uint *)((long)pdu + 4)) goto LAB_0010a3e2;
      pcVar8 = 
      "RTR Socket: The PDU is malformed, because the specified size doesn\'t match the real PDU size."
      ;
    }
switchD_0010a1fe_caseD_5:
    lrtr_dbg(pcVar8);
    goto LAB_0010a554;
  }
  if (*(int *)((long)pdu + 4) == iVar4) {
LAB_0010a3e2:
    rtr_pdu_convert_footer_byte_order(pdu,TO_HOST_HOST_BYTE_ORDER);
    if (((bVar3 & 0xfd) == 4) && (*(char *)((long)pdu + 0xb) != '\0')) {
      lrtr_dbg("RTR Socket: Warning: Zero field of received Prefix PDU doesn\'t contain 0");
    }
    if (bVar3 == 9) {
      iVar6 = 0;
      if (*(char *)((long)pdu + 3) != '\0') {
        lrtr_dbg("RTR Socket: Warning: ROUTER_KEY_PDU zero field is != 0");
      }
      goto LAB_0010a37f;
    }
    if (bVar3 == 0xb) {
      iVar4 = 4;
      if (*pdu != '\x02') goto LAB_0010a20d;
      if (*(short *)((long)pdu + 2) != 0) {
        lrtr_dbg("RTR Socket: Warning: Zero field of received ASPA PDU doesn\'t contain 0");
      }
      if (*(char *)((long)pdu + 9) != '\x03') {
        lrtr_dbg("RTR Socket: Warning: AFI flags of received ASPA PDU not set to 0x03");
      }
    }
    iVar6 = 0;
    goto LAB_0010a37f;
  }
LAB_0010a554:
  iVar4 = 0;
  lrtr_dbg("RTR Socket: Received malformed PDU!");
LAB_0010a20d:
  switch(iVar4) {
  case 0:
    lrtr_dbg("RTR Socket: corrupt PDU received");
    pcVar8 = "corrupt data received, length value in PDU is too small";
    pVar5 = CORRUPT_DATA;
    err_text_len = 0x38;
    goto LAB_0010a36d;
  case 1:
  case 2:
  case 3:
  case 6:
  case 7:
    break;
  case 4:
    lrtr_dbg("RTR Socket: PDU with unsupported Protocol version (%u) received",local_70 & 0xff);
    pVar5 = UNSUPPORTED_PROTOCOL_VER;
    goto LAB_0010a337;
  case 5:
    lrtr_dbg("RTR Socket: Unsupported PDU type (%u) received",local_70 >> 8 & 0xff);
    pVar5 = UNSUPPORTED_PDU_TYPE;
    pcVar8 = (char *)0x0;
    err_text_len = 0;
LAB_0010a36d:
    rtr_send_error_pdu(rtr_socket,pdu,8,pVar5,pcVar8,err_text_len);
    break;
  case 8:
    lrtr_dbg("RTR Socket: PDU with unexpected Protocol version (%u) received",local_70 & 0xff);
    pVar5 = UNEXPECTED_PROTOCOL_VERSION;
LAB_0010a337:
    rtr_send_error_pdu(rtr_socket,pdu,8,pVar5,(char *)0x0,0);
    goto LAB_0010a37f;
  case -3:
    lrtr_dbg("RTR Socket: receive call interrupted");
    iVar6 = -3;
    goto LAB_0010a37f;
  case -2:
    lrtr_dbg("RTR Socket: receive timeout expired");
    iVar6 = -2;
    goto LAB_0010a37f;
  case -1:
    new_state = RTR_ERROR_TRANSPORT;
    goto LAB_0010a37a;
  default:
    if (iVar4 == 0x20) {
      lrtr_dbg("RTR Socket: PDU too big");
      pcVar8 = local_68;
      snprintf(pcVar8,0x2b,"PDU too big, max. PDU size is: %lu bytes");
      lrtr_dbg("RTR Socket: %s",pcVar8);
      pVar5 = CORRUPT_DATA;
      err_text_len = 0x2b;
      goto LAB_0010a36d;
    }
  }
  new_state = RTR_ERROR_FATAL;
LAB_0010a37a:
  rtr_change_socket_state(rtr_socket,new_state);
LAB_0010a37f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int rtr_receive_pdu(struct rtr_socket *rtr_socket, void *pdu, const size_t pdu_len, const time_t timeout)
{
	int error = RTR_SUCCESS;

	assert(pdu_len >= RTR_MAX_PDU_LEN);

	if (rtr_socket->state == RTR_SHUTDOWN)
		return RTR_ERROR;
	// receive packet header
	error = tr_recv_all(rtr_socket->tr_socket, pdu, sizeof(struct pdu_header), timeout);
	if (error < 0)
		goto error;
	else
		error = RTR_SUCCESS;

	// header in hostbyte order, retain original received pdu, in case we need to detach it to an error pdu
	struct pdu_header header;

	memcpy(&header, pdu, sizeof(header));
	rtr_pdu_header_to_host_byte_order(&header);

	// if header->len is < packet_header = corrupt data received
	if (header.len < sizeof(header)) {
		error = CORRUPT_DATA;
		goto error;
	} else if (header.len > RTR_MAX_PDU_LEN) { // PDU too big, > than MAX_PDU_LEN Bytes
		error = PDU_TOO_BIG;
		goto error;
	}

	// Handle live downgrading
	if (!rtr_socket->has_received_pdus) {
		if (header.type != ERROR && rtr_socket->version > header.ver && rtr_version_supported(header.ver)) {
			RTR_DBG("First received PDU is a version %u PDU, downgrading from version %u to %u", header.ver,
				rtr_socket->version, header.ver);
			rtr_socket->version = header.ver;
		}
		rtr_socket->has_received_pdus = true;
	}

	// Handle wrong protocol version
	// If it is a error PDU, it will be handled by rtr_handle_error_pdu
	if (header.ver != rtr_socket->version && header.type != ERROR) {
		error = UNEXPECTED_PROTOCOL_VERSION;
		goto error;
	}

	// receive packet payload
	const unsigned int remaining_len = header.len - sizeof(header);

	if (remaining_len > 0) {
		if (rtr_socket->state == RTR_SHUTDOWN)
			return RTR_ERROR;
		error = tr_recv_all(rtr_socket->tr_socket, (((char *)pdu) + sizeof(header)), remaining_len,
				    RTR_RECV_TIMEOUT);
		if (error < 0)
			goto error;
		else
			error = RTR_SUCCESS;
	}
	// copy header in host_byte_order to pdu
	memcpy(pdu, &header, sizeof(header));

	// Check if the header len value is valid
	if (rtr_pdu_check_size(pdu) == false) {
		// TODO Restore byteorder for sending error PDU
		error = CORRUPT_DATA;
		goto error;
	}
	// At this point it is save to cast and use the PDU

	rtr_pdu_footer_to_host_byte_order(pdu);

	// Here we should handle error PDUs instead of doing it in
	// several other places...

	if (header.type == IPV4_PREFIX || header.type == IPV6_PREFIX) {
		if (((struct pdu_ipv4 *)pdu)->zero != 0)
			RTR_DBG1("Warning: Zero field of received Prefix PDU doesn't contain 0");
	}
	if (header.type == ASPA) {
		if (((struct pdu_aspa *)pdu)->ver != RTR_PROTOCOL_VERSION_2) {
			error = UNSUPPORTED_PROTOCOL_VER;
			goto error;
		}

		if (((struct pdu_aspa *)pdu)->zero != 0)
			RTR_DBG1("Warning: Zero field of received ASPA PDU doesn't contain 0");

		if (((struct pdu_aspa *)pdu)->afi_flags != 0b11)
			RTR_DBG1("Warning: AFI flags of received ASPA PDU not set to 0x03");
	}
	if (header.type == ROUTER_KEY && ((struct pdu_router_key *)pdu)->zero != 0)
		RTR_DBG1("Warning: ROUTER_KEY_PDU zero field is != 0");

	return RTR_SUCCESS;

error:
	// send error msg to server, including unmodified pdu header(pdu variable instead header)
	if (error == -1) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	} else if (error == TR_WOULDBLOCK) {
		RTR_DBG1("receive timeout expired");
		return TR_WOULDBLOCK;
	} else if (error == TR_INTR) {
		RTR_DBG1("receive call interrupted");
		return TR_INTR;
	} else if (error == CORRUPT_DATA) {
		RTR_DBG1("corrupt PDU received");
		const char txt[] = "corrupt data received, length value in PDU is too small";

		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), CORRUPT_DATA, txt, sizeof(txt));
	} else if (error == PDU_TOO_BIG) {
		RTR_DBG1("PDU too big");
		char txt[43];

		snprintf(txt, sizeof(txt), "PDU too big, max. PDU size is: %lu bytes", RTR_MAX_PDU_LEN);
		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), CORRUPT_DATA, txt, sizeof(txt));
	} else if (error == UNSUPPORTED_PDU_TYPE) {
		RTR_DBG("Unsupported PDU type (%u) received", header.type);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNSUPPORTED_PDU_TYPE, NULL, 0);
	} else if (error == UNSUPPORTED_PROTOCOL_VER) {
		RTR_DBG("PDU with unsupported Protocol version (%u) received", header.ver);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNSUPPORTED_PROTOCOL_VER, NULL, 0);
		return RTR_ERROR;
	} else if (error == UNEXPECTED_PROTOCOL_VERSION) {
		RTR_DBG("PDU with unexpected Protocol version (%u) received", header.ver);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNEXPECTED_PROTOCOL_VERSION, NULL, 0);
		return RTR_ERROR;
	}

	rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
	return RTR_ERROR;
}